

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_sint64 doBufferedWrite(PHYSFS_File *handle,void *buffer,size_t len)

{
  int iVar1;
  FileHandle *fh;
  size_t len_local;
  void *buffer_local;
  PHYSFS_File *handle_local;
  
  if ((void *)((long)handle[5].opaque + len) < handle[4].opaque) {
    memcpy((void *)((long)handle[3].opaque + (long)handle[5].opaque),buffer,len);
    handle[5].opaque = (void *)(len + (long)handle[5].opaque);
    handle_local = (PHYSFS_File *)len;
  }
  else {
    iVar1 = PHYSFS_flush(handle);
    if (iVar1 == 0) {
      handle_local = (PHYSFS_File *)0xffffffffffffffff;
    }
    else {
      handle_local = (PHYSFS_File *)
                     (**(code **)((long)handle->opaque + 0x18))(handle->opaque,buffer,len);
    }
  }
  return (PHYSFS_sint64)handle_local;
}

Assistant:

static PHYSFS_sint64 doBufferedWrite(PHYSFS_File *handle, const void *buffer,
                                     const size_t len)
{
    FileHandle *fh = (FileHandle *) handle;

    /* whole thing fits in the buffer? */
    if ((fh->buffill + len) < fh->bufsize)
    {
        memcpy(fh->buffer + fh->buffill, buffer, len);
        fh->buffill += len;
        return (PHYSFS_sint64) len;
    } /* if */

    /* would overflow buffer. Flush and then write the new objects, too. */
    BAIL_IF_ERRPASS(!PHYSFS_flush(handle), -1);
    return fh->io->write(fh->io, buffer, len);
}